

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

Vec_Wrd_t * Ifd_ManDsdTruths(int nVars)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  Ifd_Obj_t *pIVar6;
  Ifd_Man_t *p;
  long lVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  Ifd_Obj_t *pIVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong local_98;
  
  p = Ifd_ManStart();
  if (1 < nVars) {
    local_98 = 1;
    uVar10 = 2;
    do {
      uVar20 = 1;
      do {
        uVar1 = uVar20 + 1;
        uVar19 = 1;
        do {
          if (uVar19 + uVar20 == uVar10) {
            if ((long)p->vMarks->nSize <= (long)uVar20) {
LAB_003f6e2c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pVVar9 = p->vMarks;
            lVar7 = (long)pVVar9->nSize;
            if (lVar7 <= (long)uVar1) goto LAB_003f6e2c;
            uVar2 = p->vMarks->pArray[uVar20];
            uVar13 = (ulong)uVar2;
            while( true ) {
              iVar11 = (int)uVar13;
              if (pVVar9->pArray[uVar1] <= iVar11) break;
              if (((int)uVar2 < 0) || (p->nObjs <= iVar11)) {
LAB_003f6e0d:
                __assert_fail("i >= 0 && i < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                              ,0x49,"Ifd_Obj_t *Ifd_ManObj(Ifd_Man_t *, int)");
              }
              if (p->pObjs == (Ifd_Obj_t *)0x0) break;
              if (((long)(int)lVar7 <= (long)uVar19) ||
                 (pVVar8 = p->vMarks, (long)pVVar8->nSize <= (long)(uVar19 + 1))) goto LAB_003f6e2c;
              pIVar17 = p->pObjs + uVar13;
              uVar3 = pVVar9->pArray[uVar19];
              iVar14 = iVar11 * 2;
              iVar12 = iVar11 * 2 + 1;
              lVar7 = (ulong)uVar3 << 4;
              iVar11 = uVar3 * 2;
              uVar22 = uVar3;
              while ((int)uVar22 < pVVar8->pArray[uVar19 + 1]) {
                if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar22)) goto LAB_003f6e0d;
                pIVar6 = p->pObjs;
                if (pIVar6 == (Ifd_Obj_t *)0x0) break;
                if (uVar20 != ((byte)pIVar17->field_0x3 & 0x1f)) {
                  __assert_fail("(int)pLeaf0->nSupp == i",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                ,0x288,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                }
                if (uVar19 != (*(byte *)((long)pIVar6->pFans + lVar7 + -1) & 0x1f)) {
                  __assert_fail("(int)pLeaf1->nSupp == j",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                ,0x289,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                }
                Ifd_ManOper(p,iVar14,iVar11,-1,1);
                if (-1 < *(int *)((long)pIVar6->pFans + lVar7 + -4)) {
                  Ifd_ManOper(p,iVar14,iVar11 + 1,-1,1);
                }
                if (-1 < *(int *)pIVar17) {
                  Ifd_ManOper(p,iVar12,iVar11,-1,1);
                }
                if ((-1 < *(int *)pIVar17) && (-1 < *(int *)((long)pIVar6->pFans + lVar7 + -4))) {
                  Ifd_ManOper(p,iVar12,iVar11 + 1,-1,1);
                }
                uVar22 = uVar22 + 1;
                lVar7 = lVar7 + 0x10;
                Ifd_ManOper(p,iVar14,iVar11,-1,2);
                pVVar8 = p->vMarks;
                iVar11 = iVar11 + 2;
                if ((long)pVVar8->nSize <= (long)(uVar19 + 1)) goto LAB_003f6e2c;
              }
              uVar13 = uVar13 + 1;
              pVVar9 = p->vMarks;
              lVar7 = (long)pVVar9->nSize;
              if (lVar7 <= (long)uVar1) goto LAB_003f6e2c;
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar10);
        uVar20 = uVar1;
      } while (uVar1 != uVar10);
      if (2 < uVar10) {
        uVar20 = 1;
        do {
          uVar1 = uVar20 + 1;
          uVar19 = 1;
          do {
            uVar13 = uVar19 + 1;
            uVar21 = 1;
            do {
              if (uVar19 + uVar20 + uVar21 == uVar10) {
                if ((long)p->vMarks->nSize <= (long)uVar20) goto LAB_003f6e2c;
                pVVar9 = p->vMarks;
                lVar7 = (long)pVVar9->nSize;
                if (lVar7 <= (long)uVar1) goto LAB_003f6e2c;
                uVar2 = p->vMarks->pArray[uVar20];
                uVar18 = (ulong)uVar2;
                while( true ) {
                  iVar11 = (int)uVar18;
                  if (pVVar9->pArray[uVar1] <= iVar11) break;
                  if (((int)uVar2 < 0) || (p->nObjs <= iVar11)) goto LAB_003f6e0d;
                  if (p->pObjs == (Ifd_Obj_t *)0x0) break;
                  if ((long)(int)lVar7 <= (long)uVar19) goto LAB_003f6e2c;
                  pVVar8 = p->vMarks;
                  lVar7 = (long)pVVar8->nSize;
                  if (lVar7 <= (long)uVar13) goto LAB_003f6e2c;
                  pIVar17 = p->pObjs + uVar18;
                  uVar3 = pVVar9->pArray[uVar19];
                  uVar15 = (ulong)uVar3;
                  while( true ) {
                    iVar14 = (int)uVar15;
                    if (pVVar8->pArray[uVar13] <= iVar14) break;
                    if (((int)uVar3 < 0) || (p->nObjs <= iVar14)) goto LAB_003f6e0d;
                    if (p->pObjs == (Ifd_Obj_t *)0x0) break;
                    if (((long)(int)lVar7 <= (long)uVar21) ||
                       (pVVar9 = p->vMarks, (long)pVVar9->nSize <= (long)(uVar21 + 1)))
                    goto LAB_003f6e2c;
                    pIVar6 = p->pObjs + uVar15;
                    uVar22 = pVVar8->pArray[uVar21];
                    lVar7 = (ulong)uVar22 << 4;
                    iVar12 = uVar22 * 2;
                    uVar16 = uVar22;
                    while ((int)uVar16 < pVVar9->pArray[uVar21 + 1]) {
                      if (((int)uVar22 < 0) || (p->nObjs <= (int)uVar16)) goto LAB_003f6e0d;
                      if (p->pObjs == (Ifd_Obj_t *)0x0) break;
                      if (uVar20 != ((byte)pIVar17->field_0x3 & 0x1f)) {
                        __assert_fail("(int)pLeaf0->nSupp == i",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                      ,0x29f,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                      }
                      if (uVar19 != ((byte)pIVar6->field_0x3 & 0x1f)) {
                        __assert_fail("(int)pLeaf1->nSupp == j",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                      ,0x2a0,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                      }
                      uVar4 = *(uint *)((long)p->pObjs->pFans + lVar7 + -4);
                      if (uVar21 != (uVar4 >> 0x18 & 0x1f)) {
                        __assert_fail("(int)pLeaf2->nSupp == k",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                      ,0x2a1,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                      }
                      if ((((-1 < (int)uVar4) || (iVar14 <= iVar11)) &&
                          (Ifd_ManOper(p,iVar11 * 2,iVar14 * 2,iVar12,3), -1 < *(int *)pIVar17)) &&
                         (-1 < *(int *)pIVar6)) {
                        Ifd_ManOper(p,iVar11 * 2 + 1,iVar14 * 2,iVar12,3);
                      }
                      uVar16 = uVar16 + 1;
                      lVar7 = lVar7 + 0x10;
                      iVar12 = iVar12 + 2;
                      pVVar9 = p->vMarks;
                      if ((long)pVVar9->nSize <= (long)(uVar21 + 1)) goto LAB_003f6e2c;
                    }
                    uVar15 = uVar15 + 1;
                    pVVar8 = p->vMarks;
                    lVar7 = (long)pVVar8->nSize;
                    if (lVar7 <= (long)uVar13) goto LAB_003f6e2c;
                  }
                  uVar18 = uVar18 + 1;
                  pVVar9 = p->vMarks;
                  lVar7 = (long)pVVar9->nSize;
                  if (lVar7 <= (long)uVar1) goto LAB_003f6e2c;
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != local_98);
            uVar19 = uVar13;
          } while (uVar13 != local_98);
          uVar20 = uVar1;
        } while (uVar1 != local_98);
      }
      Vec_IntPush(p->vMarks,p->nObjs);
      uVar10 = uVar10 + 1;
      local_98 = local_98 + 1;
    } while (uVar10 != nVars + 1);
  }
  Ifd_ManTruthAll(p);
  Mpm_ComputeCnfSizeAll(p);
  pVVar5 = p->vTruths;
  p->vTruths = (Vec_Wrd_t *)0x0;
  Ifd_ManStop(p);
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Ifd_ManDsdTruths( int nVars )
{
    int fUseMux = 1;
    Vec_Wrd_t * vTruths;
    Ifd_Man_t * pMan = Ifd_ManStart();
    Ifd_Obj_t * pLeaf0, * pLeaf1, * pLeaf2;
    int v, i, j, k, c0, c1, c2;
    for ( v = 2; v <= nVars; v++ )
    {
        // create ANDs/XORs
        for ( i = 1; i < v; i++ )
        for ( j = 1; j < v; j++ )
        if ( i + j == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 1), -1, 1 );
                if ( !pLeaf0->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 1), -1, 1 );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 2 );
            }
        }
        // create MUX
        if ( fUseMux )
        for ( i = 1; i < v-1; i++ )
        for ( j = 1; j < v-1; j++ )
        for ( k = 1; k < v-1; k++ )
        if ( i + j + k == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            Ifd_ManForEachNodeWithSupp( pMan, k, pLeaf2, c2 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                assert( (int)pLeaf2->nSupp == k );
//printf( "%d %d %d   ", i, j, k );
//printf( "%d %d %d\n", Ifd_ObjId(pMan, pLeaf0), Ifd_ObjId(pMan, pLeaf1), Ifd_ObjId(pMan, pLeaf2) );
                if ( pLeaf2->fWay && c0 < c1 )
                    continue;
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
            }
        }
        // bookmark
        Vec_IntPush( pMan->vMarks, pMan->nObjs );
    }
    Ifd_ManTruthAll( pMan );
    Mpm_ComputeCnfSizeAll( pMan );
//    Ifd_ManPrint( pMan );
    vTruths = pMan->vTruths; pMan->vTruths = NULL;
    Ifd_ManStop( pMan );
    return vTruths;
}